

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O3

void DES_ede3_cbc_encrypt_ex
               (uint8_t *in,uint8_t *out,size_t len,DES_key_schedule *ks1,DES_key_schedule *ks2,
               DES_key_schedule *ks3,uint8_t *ivec,int enc)

{
  byte *pbVar1;
  DES_key_schedule *ks2_00;
  DES_key_schedule *pDVar2;
  uint8_t uVar3;
  uint uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint uVar7;
  uint uVar8;
  uint8_t uVar9;
  uint uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  long lVar13;
  uint local_58;
  uint local_54;
  DES_key_schedule *local_50;
  DES_key_schedule *local_48;
  uint local_3c;
  DES_key_schedule *local_38;
  
  uVar4 = *(uint *)ivec;
  uVar8 = *(uint *)(ivec + 4);
  local_50 = (DES_key_schedule *)ks1;
  local_48 = (DES_key_schedule *)ks2;
  if (enc == 0) {
    uVar10 = uVar4;
    uVar7 = uVar8;
    pDVar2 = (DES_key_schedule *)ks3;
    if (7 < len) {
      do {
        local_38 = pDVar2;
        uVar4 = *(uint *)in;
        uVar8 = *(uint *)((long)in + 4);
        in = (uint8_t *)((long)in + 8);
        local_58 = uVar4;
        local_54 = uVar8;
        local_3c = uVar7;
        DES_decrypt3(&local_58,local_50,local_48,local_38);
        uVar10 = uVar10 ^ local_58;
        local_54 = local_3c ^ local_54;
        *out = (uint8_t)uVar10;
        out[1] = (uint8_t)(uVar10 >> 8);
        out[2] = (uint8_t)(uVar10 >> 0x10);
        out[3] = (uint8_t)(uVar10 >> 0x18);
        out[4] = (uint8_t)local_54;
        out[5] = (uint8_t)(local_54 >> 8);
        out[6] = (uint8_t)(local_54 >> 0x10);
        out[7] = (uint8_t)(local_54 >> 0x18);
        out = out + 8;
        len = len - 8;
        ks3 = (DES_key_schedule *)local_38;
        uVar10 = uVar4;
        uVar7 = uVar8;
        pDVar2 = local_38;
      } while (7 < len);
    }
    ks2_00 = local_48;
    pDVar2 = local_50;
    if (len != 0) {
      local_58 = *(uint *)in;
      local_54 = *(uint *)((long)in + 4);
      local_48 = (DES_key_schedule *)CONCAT44(local_48._4_4_,local_58);
      local_50 = (DES_key_schedule *)CONCAT44(local_50._4_4_,local_54);
      DES_decrypt3(&local_58,pDVar2,ks2_00,(DES_key_schedule *)ks3);
      (*(code *)(&DAT_001e06b4 + *(int *)(&DAT_001e06b4 + (len - 1) * 4)))();
      return;
    }
    *ivec = (uint8_t)uVar4;
    ivec[1] = (uint8_t)(uVar4 >> 8);
    ivec[2] = (uint8_t)(uVar4 >> 0x10);
    ivec[3] = (uint8_t)(uVar4 >> 0x18);
    ivec[4] = (uint8_t)uVar8;
    ivec[5] = (uint8_t)(uVar8 >> 8);
    ivec[6] = (uint8_t)(uVar8 >> 0x10);
    uVar6 = (uint8_t)(uVar8 >> 0x18);
    goto LAB_00165210;
  }
  local_58 = uVar4;
  local_54 = uVar8;
  if (7 < len) {
    do {
      local_58 = uVar4 ^ *(uint *)in;
      local_54 = uVar8 ^ *(uint *)((long)in + 4);
      in = (uint8_t *)((long)in + 8);
      DES_encrypt3(&local_58,local_50,local_48,(DES_key_schedule *)ks3);
      *out = (uint8_t)local_58;
      out[1] = (uint8_t)(local_58 >> 8);
      out[2] = (uint8_t)(local_58 >> 0x10);
      out[3] = (uint8_t)(local_58 >> 0x18);
      out[4] = (uint8_t)local_54;
      out[5] = (uint8_t)(local_54 >> 8);
      out[6] = (uint8_t)(local_54 >> 0x10);
      out[7] = (uint8_t)(local_54 >> 0x18);
      out = out + 8;
      len = len - 8;
      uVar4 = local_58;
      uVar8 = local_54;
    } while (7 < len);
  }
  if (len == 0) {
    uVar3 = (uint8_t)(local_58 >> 8);
    uVar5 = (uint8_t)(local_58 >> 0x10);
    uVar9 = (uint8_t)(local_58 >> 0x18);
    uVar11 = (uint8_t)(local_54 >> 8);
    uVar12 = (uint8_t)(local_54 >> 0x10);
    uVar6 = (uint8_t)(local_54 >> 0x18);
  }
  else {
    lVar13 = (long)in + len;
    uVar4 = 0;
    switch(len) {
    case 1:
      uVar10 = 0;
      goto LAB_00165103;
    case 2:
      uVar10 = 0;
      goto LAB_001650f6;
    case 3:
      uVar10 = 0;
      uVar8 = uVar4;
      break;
    case 7:
      pbVar1 = (byte *)(lVar13 + -1);
      lVar13 = lVar13 + -1;
      uVar4 = (uint)*pbVar1 << 0x10;
    case 6:
      pbVar1 = (byte *)(lVar13 + -1);
      lVar13 = lVar13 + -1;
      uVar4 = uVar4 | (uint)*pbVar1 << 8;
    case 5:
      pbVar1 = (byte *)(lVar13 + -1);
      lVar13 = lVar13 + -1;
      uVar4 = uVar4 | *pbVar1;
    case 4:
      pbVar1 = (byte *)(lVar13 + -1);
      lVar13 = lVar13 + -1;
      uVar8 = (uint)*pbVar1 << 0x18;
      uVar10 = uVar4;
    }
    pbVar1 = (byte *)(lVar13 + -1);
    lVar13 = lVar13 + -1;
    uVar4 = uVar8 | (uint)*pbVar1 << 0x10;
LAB_001650f6:
    pbVar1 = (byte *)(lVar13 + -1);
    lVar13 = lVar13 + -1;
    uVar4 = uVar4 | (uint)*pbVar1 << 8;
LAB_00165103:
    local_58 = (*(byte *)(lVar13 + -1) | uVar4) ^ local_58;
    local_54 = uVar10 ^ local_54;
    DES_encrypt3(&local_58,local_50,local_48,(DES_key_schedule *)ks3);
    *out = (uint8_t)local_58;
    uVar3 = (uint8_t)(local_58 >> 8);
    out[1] = uVar3;
    uVar5 = (uint8_t)(local_58 >> 0x10);
    out[2] = uVar5;
    uVar9 = (uint8_t)(local_58 >> 0x18);
    out[3] = uVar9;
    out[4] = (uint8_t)local_54;
    uVar11 = (uint8_t)(local_54 >> 8);
    out[5] = uVar11;
    uVar12 = (uint8_t)(local_54 >> 0x10);
    out[6] = uVar12;
    uVar6 = (uint8_t)(local_54 >> 0x18);
    out[7] = uVar6;
  }
  *ivec = (uint8_t)local_58;
  ivec[1] = uVar3;
  ivec[2] = uVar5;
  ivec[3] = uVar9;
  ivec[4] = (uint8_t)local_54;
  ivec[5] = uVar11;
  ivec[6] = uVar12;
LAB_00165210:
  ivec[7] = uVar6;
  return;
}

Assistant:

void DES_ede3_cbc_encrypt_ex(const uint8_t *in, uint8_t *out, size_t len,
                             const DES_key_schedule *ks1,
                             const DES_key_schedule *ks2,
                             const DES_key_schedule *ks3, uint8_t ivec[8],
                             int enc) {
  uint32_t tin0, tin1;
  uint32_t tout0, tout1, xor0, xor1;
  uint32_t tin[2];
  uint8_t *iv;

  iv = ivec;

  if (enc) {
    c2l(iv, tout0);
    c2l(iv, tout1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);
      tin0 ^= tout0;
      tin1 ^= tout1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_encrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      l2c(tout0, out);
      l2c(tout1, out);
    }
    if (len != 0) {
      c2ln(in, tin0, tin1, len);
      tin0 ^= tout0;
      tin1 ^= tout1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_encrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      l2c(tout0, out);
      l2c(tout1, out);
    }
    iv = ivec;
    l2c(tout0, iv);
    l2c(tout1, iv);
  } else {
    uint32_t t0, t1;

    c2l(iv, xor0);
    c2l(iv, xor1);
    for (; len >= 8; len -= 8) {
      c2l(in, tin0);
      c2l(in, tin1);

      t0 = tin0;
      t1 = tin1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_decrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      tout0 ^= xor0;
      tout1 ^= xor1;
      l2c(tout0, out);
      l2c(tout1, out);
      xor0 = t0;
      xor1 = t1;
    }
    if (len != 0) {
      c2l(in, tin0);
      c2l(in, tin1);

      t0 = tin0;
      t1 = tin1;

      tin[0] = tin0;
      tin[1] = tin1;
      DES_decrypt3(tin, ks1, ks2, ks3);
      tout0 = tin[0];
      tout1 = tin[1];

      tout0 ^= xor0;
      tout1 ^= xor1;
      l2cn(tout0, tout1, out, len);
      xor0 = t0;
      xor1 = t1;
    }

    iv = ivec;
    l2c(xor0, iv);
    l2c(xor1, iv);
  }

  tin[0] = tin[1] = 0;
}